

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O2

void readTiledRgba1(char *fileName,Array2D<Imf_3_2::Rgba> *pixels,int *width,int *height)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long sizeX;
  int iVar4;
  TiledRgbaInputFile in;
  
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile(&in,fileName,iVar1);
  piVar3 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
  iVar1 = *piVar3;
  iVar2 = piVar3[1];
  iVar4 = piVar3[3];
  *width = (piVar3[2] - iVar1) + 1;
  sizeX = ((long)iVar4 - (long)iVar2) + 1;
  *height = (int)sizeX;
  Imf_3_2::Array2D<Imf_3_2::Rgba>::resizeErase(pixels,sizeX,(long)*width);
  Imf_3_2::TiledRgbaInputFile::setFrameBuffer
            ((Rgba *)&in,(ulong)(pixels->_data + -(long)iVar2 * pixels->_sizeY + (long)-iVar1),1);
  iVar4 = (int)&in;
  iVar1 = Imf_3_2::TiledRgbaInputFile::numXTiles(iVar4);
  iVar2 = Imf_3_2::TiledRgbaInputFile::numYTiles(iVar4);
  Imf_3_2::TiledRgbaInputFile::readTiles(iVar4,0,iVar1 + -1,0,iVar2 + -1);
  Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile(&in);
  return;
}

Assistant:

void
readTiledRgba1 (
    const char fileName[], Array2D<Rgba>& pixels, int& width, int& height)
{
    TiledRgbaInputFile in (fileName);
    Box2i              dw = in.dataWindow ();

    width  = dw.max.x - dw.min.x + 1;
    height = dw.max.y - dw.min.y + 1;
    int dx = dw.min.x;
    int dy = dw.min.y;

    pixels.resizeErase (height, width);

    in.setFrameBuffer (&pixels[-dy][-dx], 1, width);
    in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () - 1);
}